

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_InsideMap_Test::TestBody
          (MessageDifferencerTest_IgnoreField_InsideMap_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *pRVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar2;
  FieldDescriptor *field;
  FieldDescriptor *key;
  FieldDescriptor *field_00;
  Arena *pAVar3;
  allocator<char> local_339;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  TestDiffMessage msg2;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pRVar1 = &msg1.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.a_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 5;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"foo",pAVar3);
  RepeatedField<int>::Add(&(pVVar2->field_0)._impl_.ra_,1);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.a_ = 2;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 5;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"bar",pAVar3);
  RepeatedField<int>::Add(&(pVVar2->field_0)._impl_.ra_,2);
  pRVar1 = &msg2.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.a_ = 2;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 5;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"bar",pAVar3);
  RepeatedField<int>::Add(&(pVVar2->field_0)._impl_.ra_,2);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.a_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 5;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"baz",pAVar3);
  RepeatedField<int>::Add(&(pVVar2->field_0)._impl_.ra_,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&differencer,"item",&local_339);
  field = GetFieldDescriptor(&msg1.super_Message,(string *)&differencer);
  std::__cxx11::string::~string((string *)&differencer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&differencer,"item.a",&local_339);
  key = GetFieldDescriptor(&msg1.super_Message,(string *)&differencer);
  std::__cxx11::string::~string((string *)&differencer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&differencer,"item.b",&local_339);
  field_00 = GetFieldDescriptor(&msg1.super_Message,(string *)&differencer);
  std::__cxx11::string::~string((string *)&differencer);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::IgnoreField(&differencer,field_00);
  util::MessageDifferencer::TreatAsMap(&differencer,field,key);
  ExpectEqualsWithDifferencer(&differencer,&msg1.super_Message,&msg2.super_Message);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_InsideMap) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestDiffMessage::Item* item;

  item = msg1.add_item();
  item->set_a(1);
  item->set_b("foo");
  item->add_ra(1);

  item = msg1.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(1);
  item->set_b("baz");
  item->add_ra(1);

  const FieldDescriptor* item_desc = GetFieldDescriptor(msg1, "item");
  const FieldDescriptor* a = GetFieldDescriptor(msg1, "item.a");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "item.b");

  util::MessageDifferencer differencer;
  differencer.IgnoreField(b);
  differencer.TreatAsMap(item_desc, a);

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}